

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStateReset.cpp
# Opt level: O2

void glu::anon_unknown_2::resetErrors(Functions *gl)

{
  GLenum GVar1;
  TestError *this;
  long lVar2;
  
  lVar2 = 0xb;
  do {
    lVar2 = lVar2 + -1;
    if (lVar2 == 0) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Couldn\'t reset error state",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluStateReset.cpp"
                 ,0x34);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    GVar1 = (*gl->getError)();
  } while (GVar1 != 0);
  return;
}

Assistant:

void resetErrors (const glw::Functions& gl)
{
	size_t errorNdx = 0;

	for (errorNdx = 0; errorNdx < MAX_ERROR_COUNT; errorNdx++)
	{
		if (gl.getError() == GL_NONE)
			break;
	}

	if (errorNdx == MAX_ERROR_COUNT)
		TCU_FAIL("Couldn't reset error state");
}